

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::
         write_significand<fmt::v10::appender,char,char_const*,fmt::v10::detail::digit_grouping<char>>
                   (appender out,char *significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  appender aVar1;
  basic_string_view<char> digits;
  undefined **local_240;
  undefined1 *local_238;
  long lStack_230;
  undefined8 local_228;
  undefined1 local_220 [504];
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    aVar1 = write_significand<fmt::v10::appender,char>
                      (out,significand,significand_size,integral_size,decimal_point);
    return (appender)aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  }
  lStack_230 = 0;
  local_240 = &PTR_grow_00294148;
  local_228 = 500;
  local_238 = local_220;
  write_significand<fmt::v10::appender,char>
            ((appender)&local_240,significand,significand_size,integral_size,decimal_point);
  if (-1 < integral_size) {
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_238;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v10::appender,char>(grouping,out,digits);
    aVar1 = copy_str_noinline<char,char*,fmt::v10::appender>
                      (local_238 + (uint)integral_size,local_238 + lStack_230,out);
    if (local_238 != local_220) {
      operator_delete(local_238);
    }
    return (appender)
           aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
              ,0x189,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}